

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ValidateEnumTest_GenerateEnumDataSequential_Test::
TestBody(ValidateEnumTest_GenerateEnumDataSequential_Test *this)

{
  initializer_list<int> v;
  initializer_list<int> v_00;
  bool bVar1;
  char *pcVar2;
  _Tuple_impl<0UL,_unsigned_int,_unsigned_int> in_stack_fffffffffffffea0;
  AssertHelper local_128;
  Message local_120;
  int local_118 [6];
  iterator local_100;
  undefined8 local_f8;
  Span<const_int> local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  uint32_t local_c8;
  uint32_t local_c4;
  testing local_c0 [8];
  char local_b8 [8];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [3];
  int local_80 [4];
  iterator local_70;
  undefined8 local_68;
  Span<const_int> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  uint32_t local_38;
  uint32_t local_34;
  testing local_30 [8];
  char local_28 [8];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ValidateEnumTest_GenerateEnumDataSequential_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_34 = Make32(0,4);
  local_38 = Make32(0,0);
  testing::ElementsAre<unsigned_int,unsigned_int>(local_30,&local_34,&local_38);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_int,unsigned_int>>>
            ((ElementsAreMatcher<std::tuple<unsigned_int,_unsigned_int>_>)in_stack_fffffffffffffea0)
  ;
  local_80[0] = 0;
  local_80[1] = 1;
  local_80[2] = 2;
  local_80[3] = 3;
  local_70 = local_80;
  local_68 = 4;
  v_00._M_len = 4;
  v_00._M_array = local_70;
  absl::lts_20250127::Span<int_const>::Span<int_const,int_const>((Span<int_const> *)&local_60,v_00);
  GenerateEnumData(&local_50,local_60);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_int,unsigned_int>>>
  ::operator()(local_20,local_28,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               "GenerateEnumData({0, 1, 2, 3})");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util_test.cc"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_c4 = Make32(0xfffe,6);
  local_c8 = Make32(0,0);
  testing::ElementsAre<unsigned_int,unsigned_int>(local_c0,&local_c4,&local_c8);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_int,unsigned_int>>>
            ((ElementsAreMatcher<std::tuple<unsigned_int,_unsigned_int>_>)in_stack_fffffffffffffea0)
  ;
  local_118[4] = 2;
  local_118[5] = 3;
  local_118[0] = -2;
  local_118[1] = -1;
  local_118[2] = 0;
  local_118[3] = 1;
  local_100 = local_118;
  local_f8 = 6;
  v._M_len = 6;
  v._M_array = local_100;
  absl::lts_20250127::Span<int_const>::Span<int_const,int_const>((Span<int_const> *)&local_f0,v);
  GenerateEnumData(&local_e0,local_f0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_int,unsigned_int>>>
  ::operator()(local_b0,local_b8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               "GenerateEnumData({-2, -1, 0, 1, 2, 3})");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util_test.cc"
               ,0xda,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TEST(ValidateEnumTest, GenerateEnumDataSequential) {
  EXPECT_THAT(GenerateEnumData({0, 1, 2, 3}), ElementsAre(
                                                  // sequence start=0, length=4
                                                  Make32(0, 4),
                                                  // no bitmap, no fallback.
                                                  Make32(0, 0)));
  EXPECT_THAT(GenerateEnumData({-2, -1, 0, 1, 2, 3}),
              ElementsAre(
                  // sequence start=-2, length=6
                  Make32(-2, 6),
                  // no bitmap, no fallback.
                  Make32(0, 0)));
}